

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1f8b69a::File::~File(File *this,void **vtt)

{
  void **vtt_local;
  File *this_local;
  
  (this->super_ReaderWriter).super_Reader = (Reader)*vtt;
  *(void **)(&(this->super_ReaderWriter).super_Reader.field_0x0 +
            *(long *)((long)(this->super_ReaderWriter).super_Reader + -0x30)) = vtt[8];
  (this->super_ReaderWriter).super_Writer = *(Writer *)(vtt + 9);
  (**(code **)((long)(this->super_ReaderWriter).super_Reader + 0x18))();
  dap::ReaderWriter::~ReaderWriter(&this->super_ReaderWriter,vtt + 1);
  return;
}

Assistant:

~File() { close(); }